

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O2

bool __thiscall TripleBuffer<stStateUI>::update(TripleBuffer<stStateUI> *this,bool force)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  
  std::mutex::lock(&this->mutex);
  bVar4 = this->hasChanged ^ 1U | force;
  if (bVar4 == 1) {
    this->hasChanged = true;
    bVar1 = (this->super_stStateUI).flags.resetOptimization;
    bVar2 = (this->super_stStateUI).flags.changeProcessing;
    bVar3 = (this->super_stStateUI).flags.applyParameters;
    (this->buffer).flags.recalculateSimilarityMap =
         (this->super_stStateUI).flags.recalculateSimilarityMap;
    (this->buffer).flags.resetOptimization = bVar1;
    (this->buffer).flags.changeProcessing = bVar2;
    (this->buffer).flags.applyParameters = bVar3;
    (this->buffer).flags.applyHints = (this->super_stStateUI).flags.applyHints;
    if (((this->super_stStateUI).flags.recalculateSimilarityMap != false) ||
       ((this->super_stStateUI).flags.resetOptimization == true)) {
      stParameters::operator=(&(this->buffer).params,&(this->super_stStateUI).params);
      stKeyPressCollection<short>::operator=
                (&(this->buffer).keyPresses,&(this->super_stStateUI).keyPresses);
    }
    if ((this->super_stStateUI).flags.changeProcessing == true) {
      (this->buffer).processing = (this->super_stStateUI).processing;
    }
    if ((this->super_stStateUI).flags.applyParameters == true) {
      stParameters::operator=(&(this->buffer).params,&(this->super_stStateUI).params);
    }
    if ((this->super_stStateUI).flags.applyHints == true) {
      stKeyPressCollection<short>::operator=
                (&(this->buffer).keyPresses,&(this->super_stStateUI).keyPresses);
    }
    (this->super_stStateUI).flags.applyHints = false;
    (this->super_stStateUI).flags.recalculateSimilarityMap = false;
    (this->super_stStateUI).flags.resetOptimization = false;
    (this->super_stStateUI).flags.changeProcessing = false;
    (this->super_stStateUI).flags.applyParameters = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return (bool)bVar4;
}

Assistant:

bool TripleBuffer<stStateUI>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.recalculateSimilarityMap || this->flags.resetOptimization) {
        buffer.params = this->params;
        buffer.keyPresses = this->keyPresses;
    }

    if (this->flags.changeProcessing) {
        buffer.processing = this->processing;
    }

    if (this->flags.applyParameters) {
        buffer.params = this->params;
    }

    if (this->flags.applyHints) {
        buffer.keyPresses = this->keyPresses;
    }

    this->flags.clear();

    return true;
}